

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_group_scrolled_end(nk_context *ctx)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_panel *pnVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  nk_rect r;
  nk_window pan;
  nk_window local_208;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x489e,"void nk_group_scrolled_end(struct nk_context *)");
  }
  pnVar1 = ctx->current;
  if (pnVar1 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x489f,"void nk_group_scrolled_end(struct nk_context *)");
  }
  pnVar2 = pnVar1->layout;
  if (pnVar2 == (nk_panel *)0x0) {
    __assert_fail("win->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x48a6,"void nk_group_scrolled_end(struct nk_context *)");
  }
  pnVar3 = pnVar2->parent;
  if (pnVar3 != (nk_panel *)0x0) {
    memset(&local_208,0,0x1d8);
    local_208.bounds.h = (pnVar2->menu).h;
    local_208.bounds.y = (pnVar2->bounds).y - (pnVar2->header_height + local_208.bounds.h);
    fVar6 = (ctx->style).window.group_padding.x;
    local_208.bounds.x = (pnVar2->bounds).x - fVar6;
    local_208.bounds.w = fVar6 + fVar6 + (pnVar2->bounds).w;
    local_208.bounds.h = pnVar2->header_height + (pnVar2->bounds).h + local_208.bounds.h;
    local_208.flags = pnVar2->flags;
    if ((local_208.flags & 1) != 0) {
      fVar5 = pnVar2->border;
      local_208.bounds.x = local_208.bounds.x - fVar5;
      local_208.bounds.y = local_208.bounds.y - fVar5;
      local_208.bounds.w = local_208.bounds.w + fVar5 + fVar5;
      local_208.bounds.h = fVar5 + fVar5 + local_208.bounds.h;
    }
    if ((local_208.flags & 0x20) == 0) {
      local_208.bounds.w = (ctx->style).window.scrollbar_size.x + local_208.bounds.w;
      local_208.bounds.h = (ctx->style).window.scrollbar_size.y + local_208.bounds.h;
    }
    local_208.scrollbar.x = *pnVar2->offset_x;
    local_208.scrollbar.y = *pnVar2->offset_y;
    local_208.buffer.base = (pnVar1->buffer).base;
    local_208.buffer.clip.x = (pnVar1->buffer).clip.x;
    local_208.buffer.clip.y = (pnVar1->buffer).clip.y;
    local_208.buffer.clip.w = (pnVar1->buffer).clip.w;
    local_208.buffer.clip.h = (pnVar1->buffer).clip.h;
    local_208.buffer.use_clipping = (pnVar1->buffer).use_clipping;
    local_208.buffer._28_4_ = *(undefined4 *)&(pnVar1->buffer).field_0x1c;
    local_208.buffer.userdata = (pnVar1->buffer).userdata;
    local_208.buffer.begin = (pnVar1->buffer).begin;
    local_208.buffer.end = (pnVar1->buffer).end;
    local_208.buffer.last = (pnVar1->buffer).last;
    ctx->current = &local_208;
    fVar6 = fVar6 + local_208.bounds.h + local_208.bounds.y;
    fVar5 = (pnVar3->clip).x;
    fVar8 = (pnVar3->clip).y;
    fVar4 = local_208.bounds.x;
    if (local_208.bounds.x <= fVar5) {
      fVar4 = fVar5;
    }
    fVar5 = fVar5 + (pnVar3->clip).w;
    fVar7 = local_208.bounds.y;
    if (local_208.bounds.y <= fVar8) {
      fVar7 = fVar8;
    }
    if (local_208.bounds.w + local_208.bounds.x <= fVar5) {
      fVar5 = local_208.bounds.w + local_208.bounds.x;
    }
    fVar8 = fVar8 + (pnVar3->clip).h;
    fVar5 = fVar5 - fVar4;
    if (fVar6 <= fVar8) {
      fVar8 = fVar6;
    }
    fVar8 = fVar8 - fVar7;
    if (fVar5 <= 0.0) {
      fVar5 = 0.0;
    }
    if (fVar8 <= 0.0) {
      fVar8 = 0.0;
    }
    r.y = fVar7;
    r.x = fVar4;
    r.h = fVar8;
    r.w = fVar5;
    local_208.layout = pnVar2;
    local_208.parent = pnVar1;
    nk_push_scissor(&local_208.buffer,r);
    nk_end(ctx);
    (pnVar1->buffer).end = local_208.buffer.end;
    (pnVar1->buffer).last = local_208.buffer.last;
    (pnVar1->buffer).userdata = local_208.buffer.userdata;
    (pnVar1->buffer).begin = local_208.buffer.begin;
    (pnVar1->buffer).clip.w = local_208.buffer.clip.w;
    (pnVar1->buffer).clip.h = local_208.buffer.clip.h;
    (pnVar1->buffer).use_clipping = local_208.buffer.use_clipping;
    *(undefined4 *)&(pnVar1->buffer).field_0x1c = local_208.buffer._28_4_;
    (pnVar1->buffer).base = local_208.buffer.base;
    (pnVar1->buffer).clip.x = local_208.buffer.clip.x;
    (pnVar1->buffer).clip.y = local_208.buffer.clip.y;
    nk_push_scissor(&pnVar1->buffer,pnVar3->clip);
    ctx->current = pnVar1;
    pnVar1->layout = pnVar3;
    (pnVar2->bounds).x = local_208.bounds.x;
    (pnVar2->bounds).y = local_208.bounds.y;
    (pnVar2->bounds).w = local_208.bounds.w;
    (pnVar2->bounds).h = local_208.bounds.h;
    return;
  }
  __assert_fail("g->parent",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x48a8,"void nk_group_scrolled_end(struct nk_context *)");
}

Assistant:

NK_API void
nk_group_scrolled_end(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_panel *parent;
    struct nk_panel *g;

    struct nk_rect clip;
    struct nk_window pan;
    struct nk_vec2 panel_padding;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return;

    /* make sure nk_group_begin was called correctly */
    NK_ASSERT(ctx->current);
    win = ctx->current;
    NK_ASSERT(win->layout);
    g = win->layout;
    NK_ASSERT(g->parent);
    parent = g->parent;

    /* dummy window */
    nk_zero_struct(pan);
    panel_padding = nk_panel_get_padding(&ctx->style, NK_PANEL_GROUP);
    pan.bounds.y = g->bounds.y - (g->header_height + g->menu.h);
    pan.bounds.x = g->bounds.x - panel_padding.x;
    pan.bounds.w = g->bounds.w + 2 * panel_padding.x;
    pan.bounds.h = g->bounds.h + g->header_height + g->menu.h;
    if (g->flags & NK_WINDOW_BORDER) {
        pan.bounds.x -= g->border;
        pan.bounds.y -= g->border;
        pan.bounds.w += 2*g->border;
        pan.bounds.h += 2*g->border;
    }
    if (!(g->flags & NK_WINDOW_NO_SCROLLBAR)) {
        pan.bounds.w += ctx->style.window.scrollbar_size.x;
        pan.bounds.h += ctx->style.window.scrollbar_size.y;
    }
    pan.scrollbar.x = *g->offset_x;
    pan.scrollbar.y = *g->offset_y;
    pan.flags = g->flags;
    pan.buffer = win->buffer;
    pan.layout = g;
    pan.parent = win;
    ctx->current = &pan;

    /* make sure group has correct clipping rectangle */
    nk_unify(&clip, &parent->clip, pan.bounds.x, pan.bounds.y,
        pan.bounds.x + pan.bounds.w, pan.bounds.y + pan.bounds.h + panel_padding.x);
    nk_push_scissor(&pan.buffer, clip);
    nk_end(ctx);

    win->buffer = pan.buffer;
    nk_push_scissor(&win->buffer, parent->clip);
    ctx->current = win;
    win->layout = parent;
    g->bounds = pan.bounds;
    return;
}